

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  size_t sVar1;
  unsigned_long uVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  
  sVar1 = glob->urllen;
  pcVar10 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
  }
  else {
    sVar4 = glob->size;
    if (sVar4 == 0) {
      CVar3 = CURLE_OK;
      bVar12 = false;
    }
    else {
      puVar6 = &glob->pattern[sVar4 - 1].content.NumRange.step;
      do {
        sVar4 = sVar4 - 1;
        iVar9 = (int)puVar6[-5];
        if (iVar9 == 3) {
          uVar2 = puVar6[-1];
          puVar6[-1] = uVar2 + *puVar6;
          if (uVar2 + *puVar6 <= puVar6[-3]) goto LAB_0011cb16;
          puVar6[-1] = ((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar6 + -4))->min_n;
LAB_0011cb12:
          bVar12 = true;
        }
        else if (iVar9 == 2) {
          cVar8 = *(char *)((long)puVar6 + -0x1e) + *(char *)((long)puVar6 + -0x1c);
          *(char *)((long)puVar6 + -0x1e) = cVar8;
          if (*(char *)((long)puVar6 + -0x1f) < cVar8) {
            *(char *)((long)puVar6 + -0x1e) =
                 (char)((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar6 + -4))->min_n;
            goto LAB_0011cb12;
          }
LAB_0011cb16:
          bVar12 = false;
        }
        else {
          if (iVar9 != 1) {
            bVar12 = false;
            curl_mprintf("internal error: invalid pattern type (%d)\n");
            CVar3 = CURLE_FAILED_INIT;
            goto LAB_0011cb52;
          }
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar6 + -4))->min_n == 0)
          goto LAB_0011cb16;
          iVar9 = *(int *)((long)puVar6 + -0x14) + 1;
          bVar12 = iVar9 == (int)puVar6[-3];
          if (bVar12) {
            iVar9 = 0;
          }
          *(int *)((long)puVar6 + -0x14) = iVar9;
        }
      } while ((sVar4 != 0) && (puVar6 = puVar6 + -6, bVar12));
      bVar12 = (bool)(bVar12 ^ 1);
      CVar3 = CURLE_OK;
    }
LAB_0011cb52:
    if (!bVar12) {
      return CVar3;
    }
  }
  if (glob->size != 0) {
    lVar11 = sVar1 + 1;
    puVar6 = &glob->pattern[0].content.NumRange.ptr_n;
    uVar7 = 0;
    do {
      iVar9 = *(int *)(puVar6 + -4);
      if (iVar9 == 3) {
        curl_msnprintf(pcVar10,lVar11,"%0*lu",*(int *)(puVar6 + -1),*puVar6);
LAB_0011cbe5:
        sVar5 = strlen(pcVar10);
        pcVar10 = pcVar10 + sVar5;
        lVar11 = lVar11 - sVar5;
      }
      else if (iVar9 == 2) {
        if (lVar11 == 0) {
          lVar11 = 0;
        }
        else {
          *pcVar10 = *(char *)((long)puVar6 + -0x16);
          pcVar10[1] = '\0';
          pcVar10 = pcVar10 + 1;
          lVar11 = lVar11 + -1;
        }
      }
      else {
        if (iVar9 != 1) {
          curl_mprintf("internal error: invalid pattern type (%d)\n");
          return CURLE_FAILED_INIT;
        }
        if (((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar6 + -3))->min_n != 0) {
          curl_msnprintf(pcVar10,lVar11,"%s",
                         *(undefined8 *)
                          (((anon_struct_40_5_0c6859e6_for_NumRange *)(puVar6 + -3))->min_n +
                          (long)*(int *)((long)puVar6 + -0xc) * 8));
          goto LAB_0011cbe5;
        }
      }
      uVar7 = uVar7 + 1;
      puVar6 = puVar6 + 6;
    } while (uVar7 < glob->size);
  }
  pcVar10 = strdup(glob->glob_buffer);
  *globbed = pcVar10;
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (pcVar10 != (char *)0x0) {
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode glob_next_url(char **globbed, URLGlob *glob)
{
  URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*lu",
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}